

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O1

int nn_device_loopback(nn_device_recipe *device,int s)

{
  int iVar1;
  int iVar2;
  int flags;
  undefined1 *optval;
  int s_00;
  int s_01;
  undefined8 uVar3;
  nn_device_recipe *device_00;
  pollfd *ppVar4;
  size_t *optvallen;
  undefined8 unaff_R12;
  int op;
  size_t opsz;
  undefined1 auStack_e8 [8];
  undefined1 auStack_e0 [8];
  nn_msghdr nStack_d8;
  nn_iovec nStack_b0;
  ulong uStack_a0;
  undefined8 uStack_98;
  pollfd pStack_70;
  undefined4 uStack_68;
  short sStack_64;
  byte bStack_62;
  short sStack_5c;
  byte bStack_5a;
  short sStack_54;
  byte bStack_52;
  ulong uStack_50;
  undefined1 local_1c [4];
  size_t local_18;
  
  optvallen = &local_18;
  local_18 = 4;
  optval = local_1c;
  device_00 = (nn_device_recipe *)(ulong)(uint)s;
  iVar2 = 0;
  iVar1 = nn_getsockopt(s,0,0xc,optval,optvallen);
  if (iVar1 != 0) {
    return -1;
  }
  if (local_18 == 4) {
    nn_device_loopback_cold_2();
    return -1;
  }
  nn_device_loopback_cold_1();
  ppVar4 = &pStack_70;
  pStack_70.events = 1;
  uStack_68 = SUB84(optval,0);
  sStack_64 = 1;
  sStack_5c = 1;
  sStack_54 = 1;
  uVar3 = 4;
  uStack_50 = (ulong)(uint)s;
  iVar1 = poll(&pStack_70,4,-1);
  while( true ) {
    if (iVar1 < 0) {
      return -1;
    }
    s_01 = (int)uVar3;
    flags = (int)optval;
    if (iVar1 == 0) break;
    if (((byte)pStack_70.revents & 1) != 0) {
      pStack_70.events = 0;
    }
    if ((bStack_62 & 1) != 0) {
      sStack_64 = 0;
    }
    if ((bStack_5a & 1) != 0) {
      sStack_5c = 0;
    }
    if ((bStack_52 & 1) != 0) {
      sStack_54 = 0;
    }
    if (sStack_54 == 0 && pStack_70.events == 0) {
      optval = (undefined1 *)0x1;
      iVar1 = nn_device_mvmsg(device_00,iVar2,(int)optvallen,1);
      if (iVar1 < 0) {
        return -1;
      }
      pStack_70.events = 1;
      sStack_54 = 1;
    }
    if (sStack_64 == 0 && sStack_5c == 0) {
      optval = (undefined1 *)0x1;
      iVar1 = nn_device_mvmsg(device_00,(int)optvallen,iVar2,1);
      if (iVar1 < 0) {
        return -1;
      }
      sStack_5c = 1;
      sStack_64 = 1;
    }
    uVar3 = 4;
    ppVar4 = &pStack_70;
    iVar1 = poll(&pStack_70,4,-1);
  }
  nn_device_twoway_cold_1();
  nStack_d8.msg_control = auStack_e8;
  nStack_b0.iov_base = auStack_e0;
  nStack_d8.msg_iov = &nStack_b0;
  nStack_b0.iov_len = 0xffffffffffffffff;
  nStack_d8.msg_iovlen = 1;
  nStack_d8._12_4_ = 0;
  nStack_d8.msg_controllen = 0xffffffffffffffff;
  uStack_a0 = (ulong)optvallen & 0xffffffff;
  uStack_98 = CONCAT62((int6)((ulong)unaff_R12 >> 0x10),1);
  iVar1 = nn_recvmsg(s_01,&nStack_d8,flags);
  if (iVar1 < 0) {
    iVar2 = nn_errno();
    if (iVar2 == 0x9523dfd) {
      return -1;
    }
    iVar2 = nn_errno();
    if (iVar2 == 9) {
      return -1;
    }
    if (-1 < iVar1) goto LAB_001249fd;
  }
  else {
LAB_001249fd:
    iVar1 = (**(code **)((long)ppVar4 + 0x30))(ppVar4,s_01,s_00,flags,&nStack_d8,iVar1);
    if (iVar1 + 1U < 2) {
      return iVar1;
    }
    if (iVar1 == 1) {
      iVar1 = nn_sendmsg(s_00,&nStack_d8,flags);
      if (-1 < iVar1) {
        return 0;
      }
      iVar2 = nn_errno();
      if (-1 < iVar1 || iVar2 == 0x9523dfd) {
        return -(uint)(iVar2 == 0x9523dfd);
      }
      goto LAB_00124a74;
    }
    nn_device_mvmsg_cold_2();
  }
  nn_device_mvmsg_cold_3();
LAB_00124a74:
  nn_device_mvmsg_cold_1();
  return 1;
}

Assistant:

int nn_device_loopback (struct nn_device_recipe *device, int s)
{
    int rc;
    int op;
    size_t opsz;

    /*  Check whether the socket is a "raw" socket. */
    opsz = sizeof (op);
    rc = nn_getsockopt (s, NN_SOL_SOCKET, NN_DOMAIN, &op, &opsz);
    if (nn_slow (rc != 0))
        return -1;
    nn_assert (opsz == sizeof (op));
    if (op != AF_SP_RAW) {
        errno = EINVAL;
        return -1;
    }

    for (;;) {
        rc = nn_device_mvmsg (device, s, s, 0);
        if (nn_slow (rc < 0))
            return -1;
    }
}